

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spherei_intersector.h
# Opt level: O2

void embree::avx2::SphereMiIntersectorK<8,_4,_true>::intersect
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *sphere)

{
  float fVar1;
  float fVar2;
  float fVar3;
  byte bVar4;
  Geometry *pGVar5;
  long lVar6;
  __int_type_conflict _Var7;
  RTCFilterFunctionN p_Var8;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  uint uVar19;
  uint uVar20;
  Scene *pSVar21;
  ulong uVar22;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [16];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar28 [16];
  undefined1 auVar32 [32];
  undefined1 extraout_var [56];
  undefined4 uVar33;
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar40 [36];
  undefined1 auVar39 [64];
  float fVar41;
  float fVar44;
  float fVar45;
  float fVar46;
  undefined1 auVar42 [32];
  undefined1 auVar43 [64];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [64];
  undefined1 auVar50 [32];
  undefined1 auVar52 [32];
  undefined1 auVar54 [32];
  undefined1 in_ZMM8 [64];
  undefined1 in_ZMM9 [64];
  undefined1 auVar56 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [28];
  undefined1 auVar61 [64];
  undefined1 auVar62 [28];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [32];
  undefined1 auVar67 [64];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  SphereIntersectorHitM<8> hit;
  HitK<4> h;
  undefined1 local_3b0 [16];
  RayQueryContext *local_398;
  RTCFilterFunctionNArguments local_390;
  undefined1 local_360 [32];
  undefined1 local_330 [16];
  Scene *local_318;
  undefined1 local_310 [16];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined4 local_230;
  undefined4 uStack_22c;
  undefined4 uStack_228;
  undefined4 uStack_224;
  undefined1 local_220 [16];
  undefined1 local_210 [16];
  undefined1 local_200 [32];
  undefined1 local_1e0 [16];
  undefined1 local_1d0 [16];
  uint local_1c0;
  uint uStack_1bc;
  uint uStack_1b8;
  uint uStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  uint uStack_1a8;
  uint uStack_1a4;
  undefined1 local_1a0 [32];
  undefined1 local_170 [16];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  uint local_80 [4];
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  undefined1 auVar51 [64];
  undefined1 auVar53 [64];
  undefined1 auVar55 [64];
  undefined1 auVar57 [32];
  undefined1 auVar60 [32];
  
  pSVar21 = context->scene;
  local_80[0] = sphere->sharedGeomID;
  pGVar5 = (pSVar21->geometries).items[local_80[0]].ptr;
  lVar6 = *(long *)&pGVar5->field_0x58;
  _Var7 = pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar25._16_16_ = *(undefined1 (*) [16])(lVar6 + (sphere->primIDs).field_0.i[4] * _Var7);
  auVar25._0_16_ = *(undefined1 (*) [16])(lVar6 + (sphere->primIDs).field_0.i[0] * _Var7);
  auVar29._16_16_ = *(undefined1 (*) [16])(lVar6 + (sphere->primIDs).field_0.i[5] * _Var7);
  auVar29._0_16_ = *(undefined1 (*) [16])(lVar6 + (sphere->primIDs).field_0.i[1] * _Var7);
  auVar37._16_16_ = *(undefined1 (*) [16])(lVar6 + (sphere->primIDs).field_0.i[6] * _Var7);
  auVar37._0_16_ = *(undefined1 (*) [16])(lVar6 + (sphere->primIDs).field_0.i[2] * _Var7);
  auVar38._16_16_ = *(undefined1 (*) [16])(lVar6 + (sphere->primIDs).field_0.i[7] * _Var7);
  auVar38._0_16_ = *(undefined1 (*) [16])(lVar6 + (sphere->primIDs).field_0.i[3] * _Var7);
  auVar54 = vunpcklps_avx(auVar25,auVar37);
  auVar31 = vunpckhps_avx(auVar25,auVar37);
  auVar37 = vunpcklps_avx(auVar29,auVar38);
  auVar25 = vunpckhps_avx(auVar29,auVar38);
  auVar66 = vunpcklps_avx(auVar54,auVar37);
  auVar54 = vunpckhps_avx(auVar54,auVar37);
  auVar37 = vunpcklps_avx(auVar31,auVar25);
  auVar29 = vunpckhps_avx(auVar31,auVar25);
  bVar4 = sphere->numPrimitives;
  auVar23._1_3_ = 0;
  auVar23[0] = bVar4;
  auVar23[4] = bVar4;
  auVar23._5_3_ = 0;
  auVar23[8] = bVar4;
  auVar23._9_3_ = 0;
  auVar23[0xc] = bVar4;
  auVar23._13_3_ = 0;
  auVar23[0x10] = bVar4;
  auVar23._17_3_ = 0;
  auVar23[0x14] = bVar4;
  auVar23._21_3_ = 0;
  auVar23[0x18] = bVar4;
  auVar23._25_3_ = 0;
  auVar23[0x1c] = bVar4;
  auVar23._29_3_ = 0;
  auVar23 = vpcmpgtd_avx2(auVar23,_DAT_01fb4ba0);
  local_80[1] = local_80[0];
  local_80[2] = local_80[0];
  local_80[3] = local_80[0];
  uStack_70 = local_80[0];
  uStack_6c = local_80[0];
  uStack_68 = local_80[0];
  uStack_64 = local_80[0];
  uVar33 = *(undefined4 *)(ray + k * 4);
  auVar47._4_4_ = uVar33;
  auVar47._0_4_ = uVar33;
  auVar47._8_4_ = uVar33;
  auVar47._12_4_ = uVar33;
  auVar47._16_4_ = uVar33;
  auVar47._20_4_ = uVar33;
  auVar47._24_4_ = uVar33;
  auVar47._28_4_ = uVar33;
  auVar25 = vsubps_avx(auVar66,auVar47);
  uVar33 = *(undefined4 *)(ray + k * 4 + 0x10);
  auVar48._4_4_ = uVar33;
  auVar48._0_4_ = uVar33;
  auVar48._8_4_ = uVar33;
  auVar48._12_4_ = uVar33;
  auVar48._16_4_ = uVar33;
  auVar48._20_4_ = uVar33;
  auVar48._24_4_ = uVar33;
  auVar48._28_4_ = uVar33;
  auVar54 = vsubps_avx(auVar54,auVar48);
  uVar33 = *(undefined4 *)(ray + k * 4 + 0x20);
  auVar34._4_4_ = uVar33;
  auVar34._0_4_ = uVar33;
  auVar34._8_4_ = uVar33;
  auVar34._12_4_ = uVar33;
  auVar34._16_4_ = uVar33;
  auVar34._20_4_ = uVar33;
  auVar34._24_4_ = uVar33;
  auVar34._28_4_ = uVar33;
  fVar1 = *(float *)(ray + k * 4 + 0x40);
  auVar57._4_4_ = fVar1;
  auVar57._0_4_ = fVar1;
  auVar57._8_4_ = fVar1;
  auVar57._12_4_ = fVar1;
  auVar57._16_4_ = fVar1;
  auVar57._20_4_ = fVar1;
  auVar57._24_4_ = fVar1;
  auVar57._28_4_ = fVar1;
  auVar58 = ZEXT3264(auVar57);
  fVar2 = *(float *)(ray + k * 4 + 0x50);
  auVar60._4_4_ = fVar2;
  auVar60._0_4_ = fVar2;
  auVar60._8_4_ = fVar2;
  auVar60._12_4_ = fVar2;
  auVar60._16_4_ = fVar2;
  auVar60._20_4_ = fVar2;
  auVar60._24_4_ = fVar2;
  auVar60._28_4_ = fVar2;
  auVar61 = ZEXT3264(auVar60);
  fVar3 = *(float *)(ray + k * 4 + 0x60);
  auVar63 = ZEXT3264(CONCAT428(fVar3,CONCAT424(fVar3,CONCAT420(fVar3,CONCAT416(fVar3,CONCAT412(fVar3
                                                  ,CONCAT48(fVar3,CONCAT44(fVar3,fVar3))))))));
  auVar37 = vsubps_avx(auVar37,auVar34);
  auVar27 = vfmadd231ps_fma(ZEXT432((uint)(fVar3 * fVar3)),auVar60,auVar60);
  auVar27 = vfmadd231ps_fma(ZEXT1632(auVar27),auVar57,auVar57);
  uVar33 = auVar27._0_4_;
  auVar42._4_4_ = uVar33;
  auVar42._0_4_ = uVar33;
  auVar42._8_4_ = uVar33;
  auVar42._12_4_ = uVar33;
  auVar42._16_4_ = uVar33;
  auVar42._20_4_ = uVar33;
  auVar42._24_4_ = uVar33;
  auVar42._28_4_ = uVar33;
  auVar31 = vrcpps_avx(auVar42);
  auVar35._8_4_ = 0x3f800000;
  auVar35._0_8_ = 0x3f8000003f800000;
  auVar35._12_4_ = 0x3f800000;
  auVar35._16_4_ = 0x3f800000;
  auVar35._20_4_ = 0x3f800000;
  auVar35._24_4_ = 0x3f800000;
  auVar35._28_4_ = 0x3f800000;
  auVar27 = vfnmadd231ps_fma(auVar35,auVar31,auVar42);
  auVar27 = vfmadd132ps_fma(ZEXT1632(auVar27),auVar31,auVar31);
  auVar66._4_4_ = fVar3 * auVar37._4_4_;
  auVar66._0_4_ = fVar3 * auVar37._0_4_;
  auVar66._8_4_ = fVar3 * auVar37._8_4_;
  auVar66._12_4_ = fVar3 * auVar37._12_4_;
  auVar66._16_4_ = fVar3 * auVar37._16_4_;
  auVar66._20_4_ = fVar3 * auVar37._20_4_;
  auVar66._24_4_ = fVar3 * auVar37._24_4_;
  auVar66._28_4_ = uVar33;
  auVar28 = vfmadd231ps_fma(auVar66,auVar54,auVar60);
  auVar28 = vfmadd231ps_fma(ZEXT1632(auVar28),auVar25,auVar57);
  fVar41 = auVar28._0_4_ * auVar27._0_4_;
  fVar44 = auVar28._4_4_ * auVar27._4_4_;
  fVar45 = auVar28._8_4_ * auVar27._8_4_;
  fVar46 = auVar28._12_4_ * auVar27._12_4_;
  auVar13._4_4_ = fVar1 * fVar44;
  auVar13._0_4_ = fVar1 * fVar41;
  auVar13._8_4_ = fVar1 * fVar45;
  auVar13._12_4_ = fVar1 * fVar46;
  auVar13._16_4_ = fVar1 * 0.0;
  auVar13._20_4_ = fVar1 * 0.0;
  auVar13._24_4_ = fVar1 * 0.0;
  auVar13._28_4_ = auVar31._28_4_;
  auVar65._0_4_ = fVar2 * fVar41;
  auVar65._4_4_ = fVar2 * fVar44;
  auVar65._8_4_ = fVar2 * fVar45;
  auVar65._12_4_ = fVar2 * fVar46;
  auVar65._16_4_ = fVar2 * 0.0;
  auVar65._20_4_ = fVar2 * 0.0;
  auVar65._28_36_ = in_ZMM8._28_36_;
  auVar65._24_4_ = fVar2 * 0.0;
  auVar67._0_4_ = fVar3 * fVar41;
  auVar67._4_4_ = fVar3 * fVar44;
  auVar67._8_4_ = fVar3 * fVar45;
  auVar67._12_4_ = fVar3 * fVar46;
  auVar67._16_4_ = fVar3 * 0.0;
  auVar67._20_4_ = fVar3 * 0.0;
  auVar67._28_36_ = in_ZMM9._28_36_;
  auVar67._24_4_ = fVar3 * 0.0;
  auVar66 = vsubps_avx(auVar25,auVar13);
  auVar64 = ZEXT3264(auVar66);
  auVar54 = vsubps_avx(auVar54,auVar65._0_32_);
  auVar65 = ZEXT3264(auVar54);
  auVar37 = vsubps_avx(auVar37,auVar67._0_32_);
  auVar67 = ZEXT3264(auVar37);
  auVar31._4_4_ = auVar37._4_4_ * auVar37._4_4_;
  auVar31._0_4_ = auVar37._0_4_ * auVar37._0_4_;
  auVar31._8_4_ = auVar37._8_4_ * auVar37._8_4_;
  auVar31._12_4_ = auVar37._12_4_ * auVar37._12_4_;
  auVar31._16_4_ = auVar37._16_4_ * auVar37._16_4_;
  auVar31._20_4_ = auVar37._20_4_ * auVar37._20_4_;
  auVar31._24_4_ = auVar37._24_4_ * auVar37._24_4_;
  auVar31._28_4_ = auVar25._28_4_;
  auVar28 = vfmadd231ps_fma(auVar31,auVar54,auVar54);
  auVar28 = vfmadd231ps_fma(ZEXT1632(auVar28),auVar66,auVar66);
  auVar14._4_4_ = auVar29._4_4_ * auVar29._4_4_;
  auVar14._0_4_ = auVar29._0_4_ * auVar29._0_4_;
  auVar14._8_4_ = auVar29._8_4_ * auVar29._8_4_;
  auVar14._12_4_ = auVar29._12_4_ * auVar29._12_4_;
  auVar14._16_4_ = auVar29._16_4_ * auVar29._16_4_;
  auVar14._20_4_ = auVar29._20_4_ * auVar29._20_4_;
  auVar14._24_4_ = auVar29._24_4_ * auVar29._24_4_;
  auVar14._28_4_ = auVar29._28_4_;
  auVar31 = vcmpps_avx(ZEXT1632(auVar28),auVar14,2);
  auVar25 = auVar23 & auVar31;
  if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar25 >> 0x7f,0) != '\0') ||
        (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar25 >> 0xbf,0) != '\0') ||
      (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar25[0x1f] < '\0') {
    auVar31 = vandps_avx(auVar31,auVar23);
    auVar12 = vpackssdw_avx(auVar31._0_16_,auVar31._16_16_);
    auVar31 = vsubps_avx(auVar14,ZEXT1632(auVar28));
    auVar15._4_4_ = auVar27._4_4_ * auVar31._4_4_;
    auVar15._0_4_ = auVar27._0_4_ * auVar31._0_4_;
    auVar15._8_4_ = auVar27._8_4_ * auVar31._8_4_;
    auVar15._12_4_ = auVar27._12_4_ * auVar31._12_4_;
    auVar15._16_4_ = auVar31._16_4_ * 0.0;
    auVar15._20_4_ = auVar31._20_4_ * 0.0;
    auVar15._24_4_ = auVar31._24_4_ * 0.0;
    auVar15._28_4_ = auVar31._28_4_;
    auVar29 = vsqrtps_avx(auVar15);
    auVar49 = ZEXT3264(auVar29);
    auVar23 = vsubps_avx(ZEXT1632(CONCAT412(fVar46,CONCAT48(fVar45,CONCAT44(fVar44,fVar41)))),
                         auVar29);
    auVar50._0_4_ = fVar41 + auVar29._0_4_;
    auVar50._4_4_ = fVar44 + auVar29._4_4_;
    auVar50._8_4_ = fVar45 + auVar29._8_4_;
    auVar50._12_4_ = fVar46 + auVar29._12_4_;
    auVar50._16_4_ = auVar29._16_4_ + 0.0;
    auVar50._20_4_ = auVar29._20_4_ + 0.0;
    auVar50._24_4_ = auVar29._24_4_ + 0.0;
    auVar50._28_4_ = auVar29._28_4_ + 0.0;
    auVar51 = ZEXT3264(auVar50);
    uVar33 = *(undefined4 *)(ray + k * 4 + 0x30);
    auVar36._4_4_ = uVar33;
    auVar36._0_4_ = uVar33;
    auVar36._8_4_ = uVar33;
    auVar36._12_4_ = uVar33;
    auVar36._16_4_ = uVar33;
    auVar36._20_4_ = uVar33;
    auVar36._24_4_ = uVar33;
    auVar36._28_4_ = uVar33;
    auVar31 = vcmpps_avx(auVar36,auVar23,2);
    uVar33 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar52._4_4_ = uVar33;
    auVar52._0_4_ = uVar33;
    auVar52._8_4_ = uVar33;
    auVar52._12_4_ = uVar33;
    auVar52._16_4_ = uVar33;
    auVar52._20_4_ = uVar33;
    auVar52._24_4_ = uVar33;
    auVar52._28_4_ = uVar33;
    auVar53 = ZEXT3264(auVar52);
    auVar25 = vcmpps_avx(auVar23,auVar52,2);
    auVar31 = vandps_avx(auVar31,auVar25);
    auVar27 = vpackssdw_avx(auVar31._0_16_,auVar31._16_16_);
    local_310 = vpand_avx(auVar27,auVar12);
    auVar31 = vcmpps_avx(auVar36,auVar50,2);
    auVar25 = vcmpps_avx(auVar50,auVar52,2);
    auVar31 = vandps_avx(auVar31,auVar25);
    auVar27 = vpackssdw_avx(auVar31._0_16_,auVar31._16_16_);
    local_170 = vpand_avx(auVar27,auVar12);
    auVar27 = vpor_avx(local_310,local_170);
    local_360 = vpmovsxwd_avx2(auVar27);
    if ((((((((local_360 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_360 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_360 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_360 >> 0x7f,0) != '\0') ||
          (local_360 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_360 >> 0xbf,0) != '\0') ||
        (local_360 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_360[0x1f] < '\0') {
      auVar25 = vpmovsxwd_avx2(local_310);
      local_2c0 = vblendvps_avx(auVar50,auVar23,auVar25);
      auVar30._0_8_ = auVar29._0_8_ ^ 0x8000000080000000;
      auVar30._8_4_ = -auVar29._8_4_;
      auVar30._12_4_ = -auVar29._12_4_;
      auVar30._16_4_ = -auVar29._16_4_;
      auVar30._20_4_ = -auVar29._20_4_;
      auVar30._24_4_ = -auVar29._24_4_;
      auVar30._28_4_ = -auVar29._28_4_;
      auVar31 = vblendvps_avx(auVar29,auVar30,auVar25);
      fVar41 = auVar31._0_4_;
      fVar44 = auVar31._4_4_;
      auVar16._4_4_ = fVar1 * fVar44;
      auVar16._0_4_ = fVar1 * fVar41;
      fVar45 = auVar31._8_4_;
      auVar16._8_4_ = fVar1 * fVar45;
      fVar46 = auVar31._12_4_;
      auVar16._12_4_ = fVar1 * fVar46;
      fVar9 = auVar31._16_4_;
      auVar16._16_4_ = fVar1 * fVar9;
      fVar10 = auVar31._20_4_;
      auVar16._20_4_ = fVar1 * fVar10;
      fVar11 = auVar31._24_4_;
      auVar16._24_4_ = fVar1 * fVar11;
      auVar16._28_4_ = 0x80000000;
      auVar17._4_4_ = fVar2 * fVar44;
      auVar17._0_4_ = fVar2 * fVar41;
      auVar17._8_4_ = fVar2 * fVar45;
      auVar17._12_4_ = fVar2 * fVar46;
      auVar17._16_4_ = fVar2 * fVar9;
      auVar17._20_4_ = fVar2 * fVar10;
      auVar17._24_4_ = fVar2 * fVar11;
      auVar17._28_4_ = auVar25._28_4_;
      auVar18._4_4_ = fVar3 * fVar44;
      auVar18._0_4_ = fVar3 * fVar41;
      auVar18._8_4_ = fVar3 * fVar45;
      auVar18._12_4_ = fVar3 * fVar46;
      auVar18._16_4_ = fVar3 * fVar9;
      auVar18._20_4_ = fVar3 * fVar10;
      auVar18._24_4_ = fVar3 * fVar11;
      auVar18._28_4_ = auVar31._28_4_;
      local_2a0 = vsubps_avx(auVar16,auVar66);
      local_280 = vsubps_avx(auVar17,auVar54);
      local_260 = vsubps_avx(auVar18,auVar37);
      auVar43 = ZEXT3264(local_2c0);
      auVar31 = vpmovzxwd_avx2(auVar27);
      auVar31 = vpslld_avx2(auVar31,0x1f);
      auVar54._8_4_ = 0x7f800000;
      auVar54._0_8_ = 0x7f8000007f800000;
      auVar54._12_4_ = 0x7f800000;
      auVar54._16_4_ = 0x7f800000;
      auVar54._20_4_ = 0x7f800000;
      auVar54._24_4_ = 0x7f800000;
      auVar54._28_4_ = 0x7f800000;
      auVar55 = ZEXT3264(auVar54);
      auVar31 = vblendvps_avx(auVar54,local_2c0,auVar31);
      auVar25 = vshufps_avx(auVar31,auVar31,0xb1);
      auVar25 = vminps_avx(auVar31,auVar25);
      auVar54 = vshufpd_avx(auVar25,auVar25,5);
      auVar25 = vminps_avx(auVar25,auVar54);
      auVar37 = vpermpd_avx2(auVar25,0x4e);
      auVar25 = vminps_avx(auVar25,auVar37);
      auVar25 = vcmpps_avx(auVar31,auVar25,0);
      auVar54 = local_360 & auVar25;
      auVar31 = local_360;
      if ((((((((auVar54 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar54 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar54 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar54 >> 0x7f,0) != '\0') ||
            (auVar54 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar54 >> 0xbf,0) != '\0') ||
          (auVar54 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar54[0x1f] < '\0') {
        auVar31 = vandps_avx(auVar25,local_360);
      }
      uVar19 = vmovmskps_avx(auVar31);
      uVar20 = 0;
      for (; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x80000000) {
        uVar20 = uVar20 + 1;
      }
      auVar56 = ZEXT1664(CONCAT88(0x100000001,0x100000001));
      do {
        auVar59 = auVar61._0_28_;
        local_390.hit = (RTCHitN *)&local_230;
        local_390.valid = (int *)local_3b0;
        auVar66 = auVar67._0_32_;
        auVar54 = auVar65._0_32_;
        auVar25 = auVar64._0_32_;
        auVar62 = auVar63._0_28_;
        auVar31 = auVar58._0_32_;
        auVar40 = ZEXT436(auVar37._28_4_);
        uVar22 = (ulong)uVar20;
        uVar20 = local_80[uVar22];
        pGVar5 = (pSVar21->geometries).items[uVar20].ptr;
        local_390.ray = (RTCRayN *)ray;
        if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
          *(undefined4 *)(local_360 + uVar22 * 4) = 0;
          auVar40 = ZEXT436(auVar37._28_4_);
        }
        else {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
            auVar53 = ZEXT464(*(uint *)(local_2c0 + uVar22 * 4));
            *(uint *)(ray + k * 4 + 0x80) = *(uint *)(local_2c0 + uVar22 * 4);
            *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_2a0 + uVar22 * 4);
            *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_280 + uVar22 * 4);
            *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_260 + uVar22 * 4);
            *(undefined4 *)(ray + k * 4 + 0xf0) = 0;
            *(undefined4 *)(ray + k * 4 + 0x100) = 0;
            *(uint *)(ray + k * 4 + 0x110) = (sphere->primIDs).field_0.i[uVar22];
            *(uint *)(ray + k * 4 + 0x120) = uVar20;
            *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
            *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
LAB_0129e6ac:
            local_398 = context;
            auVar28 = vpand_avx(local_170,local_310);
            uVar33 = auVar53._0_4_;
            auVar32._4_4_ = uVar33;
            auVar32._0_4_ = uVar33;
            auVar32._8_4_ = uVar33;
            auVar32._12_4_ = uVar33;
            auVar32._16_4_ = uVar33;
            auVar32._20_4_ = uVar33;
            auVar32._24_4_ = uVar33;
            auVar32._28_4_ = uVar33;
            local_2c0 = auVar51._0_32_;
            auVar37 = vcmpps_avx(local_2c0,auVar32,2);
            auVar27 = vpackssdw_avx(auVar37._0_16_,auVar37._16_16_);
            auVar27 = vpand_avx(auVar27,auVar28);
            auVar37 = vpmovzxwd_avx2(auVar27);
            auVar37 = vpslld_avx2(auVar37,0x1f);
            if ((((((((auVar37 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar37 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar37 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar37 >> 0x7f,0) == '\0') &&
                  (auVar37 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar37 >> 0xbf,0) == '\0') &&
                (auVar37 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar37[0x1f]) {
              return;
            }
            local_360 = vpsrad_avx2(auVar37,0x1f);
            fVar1 = auVar49._0_4_;
            auVar61._0_4_ = auVar31._0_4_ * fVar1;
            fVar2 = auVar49._4_4_;
            auVar61._4_4_ = auVar31._4_4_ * fVar2;
            fVar3 = auVar49._8_4_;
            auVar61._8_4_ = auVar31._8_4_ * fVar3;
            fVar41 = auVar49._12_4_;
            auVar61._12_4_ = auVar31._12_4_ * fVar41;
            fVar44 = auVar49._16_4_;
            auVar61._16_4_ = auVar31._16_4_ * fVar44;
            fVar45 = auVar49._20_4_;
            auVar61._20_4_ = auVar31._20_4_ * fVar45;
            fVar46 = auVar49._24_4_;
            auVar61._24_4_ = auVar31._24_4_ * fVar46;
            auVar61._28_36_ = auVar40;
            auVar63._0_4_ = auVar59._0_4_ * fVar1;
            auVar63._4_4_ = auVar59._4_4_ * fVar2;
            auVar63._8_4_ = auVar59._8_4_ * fVar3;
            auVar63._12_4_ = auVar59._12_4_ * fVar41;
            auVar63._16_4_ = auVar59._16_4_ * fVar44;
            auVar63._20_4_ = auVar59._20_4_ * fVar45;
            auVar63._28_36_ = auVar43._28_36_;
            auVar63._24_4_ = auVar59._24_4_ * fVar46;
            auVar64._0_4_ = auVar62._0_4_ * fVar1;
            auVar64._4_4_ = auVar62._4_4_ * fVar2;
            auVar64._8_4_ = auVar62._8_4_ * fVar3;
            auVar64._12_4_ = auVar62._12_4_ * fVar41;
            auVar64._16_4_ = auVar62._16_4_ * fVar44;
            auVar64._20_4_ = auVar62._20_4_ * fVar45;
            auVar64._28_36_ = auVar49._28_36_;
            auVar64._24_4_ = auVar62._24_4_ * fVar46;
            local_2a0 = vsubps_avx(auVar61._0_32_,auVar25);
            local_280 = vsubps_avx(auVar63._0_32_,auVar54);
            local_260 = vsubps_avx(auVar64._0_32_,auVar66);
            pSVar21 = local_398->scene;
            auVar25 = vblendvps_avx(auVar55._0_32_,local_2c0,auVar37);
            auVar54 = vshufps_avx(auVar25,auVar25,0xb1);
            auVar54 = vminps_avx(auVar25,auVar54);
            auVar37 = vshufpd_avx(auVar54,auVar54,5);
            auVar54 = vminps_avx(auVar54,auVar37);
            auVar37 = vpermpd_avx2(auVar54,0x4e);
            auVar54 = vminps_avx(auVar54,auVar37);
            auVar25 = vcmpps_avx(auVar25,auVar54,0);
            auVar28 = vpackssdw_avx(auVar25._0_16_,auVar25._16_16_);
            auVar27 = vpand_avx(auVar28,auVar27);
            auVar25 = vpmovzxwd_avx2(auVar27);
            auVar25 = vpslld_avx2(auVar25,0x1f);
            if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar25 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar25 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar25 >> 0x7f,0) == '\0') &&
                  (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar25 >> 0xbf,0) == '\0') &&
                (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar25[0x1f]) {
              auVar25 = local_360;
            }
            uVar19 = vmovmskps_avx(auVar25);
            uVar20 = 0;
            for (; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x80000000) {
              uVar20 = uVar20 + 1;
            }
            auVar65 = ZEXT864(0) << 0x20;
            auVar31 = vpcmpeqd_avx2(auVar31,auVar31);
            auVar67 = ZEXT3264(auVar31);
            auVar58 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar27 = vpcmpeqd_avx(auVar62._0_16_,auVar62._0_16_);
            auVar61 = ZEXT1664(auVar27);
            do {
              local_390.hit = (RTCHitN *)&local_230;
              local_390.valid = (int *)local_3b0;
              uVar22 = (ulong)uVar20;
              local_1d0._4_4_ = local_80[uVar22];
              pGVar5 = (pSVar21->geometries).items[(uint)local_1d0._4_4_].ptr;
              if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                *(undefined4 *)(local_360 + uVar22 * 4) = 0;
              }
              else {
                if ((local_398->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2c0 + uVar22 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_2a0 + uVar22 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_280 + uVar22 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_260 + uVar22 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xf0) = 0;
                  *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                  *(uint *)(ray + k * 4 + 0x110) = (sphere->primIDs).field_0.i[uVar22];
                  *(undefined4 *)(ray + k * 4 + 0x120) = local_1d0._4_4_;
                  *(uint *)(ray + k * 4 + 0x130) = local_398->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = local_398->user->instPrimID[0];
                  return;
                }
                local_1e0._4_4_ = (sphere->primIDs).field_0.i[uVar22];
                local_230 = *(undefined4 *)(local_2a0 + uVar22 * 4);
                local_220._4_4_ = *(undefined4 *)(local_280 + uVar22 * 4);
                uVar33 = *(undefined4 *)(local_260 + uVar22 * 4);
                local_210._4_4_ = uVar33;
                local_210._0_4_ = uVar33;
                local_210._8_4_ = uVar33;
                local_210._12_4_ = uVar33;
                uStack_22c = local_230;
                uStack_228 = local_230;
                uStack_224 = local_230;
                local_220._0_4_ = local_220._4_4_;
                local_220._8_4_ = local_220._4_4_;
                local_220._12_4_ = local_220._4_4_;
                local_200 = auVar65._0_32_;
                local_1e0._0_4_ = local_1e0._4_4_;
                local_1e0._8_4_ = local_1e0._4_4_;
                local_1e0._12_4_ = local_1e0._4_4_;
                local_1d0._0_4_ = local_1d0._4_4_;
                local_1d0._8_4_ = local_1d0._4_4_;
                local_1d0._12_4_ = local_1d0._4_4_;
                uStack_1bc = local_398->user->instID[0];
                local_1c0 = uStack_1bc;
                uStack_1b8 = uStack_1bc;
                uStack_1b4 = uStack_1bc;
                uStack_1b0 = local_398->user->instPrimID[0];
                uStack_1ac = uStack_1b0;
                uStack_1a8 = uStack_1b0;
                uStack_1a4 = uStack_1b0;
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2c0 + uVar22 * 4);
                local_3b0 = *(undefined1 (*) [16])
                             (mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
                local_390.geometryUserPtr = pGVar5->userPtr;
                local_390.context = local_398->user;
                local_390.N = 4;
                local_2e0 = auVar51._0_32_;
                local_300 = auVar53._0_32_;
                local_330 = auVar56._0_16_;
                local_310._0_8_ = pSVar21;
                local_390.ray = (RTCRayN *)ray;
                if (pGVar5->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                  auVar31 = ZEXT1632(auVar67._0_16_);
                  auVar27 = auVar61._0_16_;
                  (*pGVar5->intersectionFilterN)(&local_390);
                  auVar27 = vpcmpeqd_avx(auVar27,auVar27);
                  auVar61 = ZEXT1664(auVar27);
                  auVar58 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar31 = vpcmpeqd_avx2(auVar31,auVar31);
                  auVar67 = ZEXT3264(auVar31);
                  auVar65 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar56 = ZEXT1664(local_330);
                  auVar53 = ZEXT3264(local_300);
                  auVar51 = ZEXT3264(local_2e0);
                  pSVar21 = (Scene *)local_310._0_8_;
                }
                auVar27 = auVar61._0_16_;
                if (local_3b0 == (undefined1  [16])0x0) {
                  auVar28 = vpcmpeqd_avx(auVar58._0_16_,(undefined1  [16])0x0);
                  auVar27 = auVar27 ^ auVar28;
                  auVar55 = ZEXT3264(CONCAT428(0x7f800000,
                                               CONCAT424(0x7f800000,
                                                         CONCAT420(0x7f800000,
                                                                   CONCAT416(0x7f800000,
                                                                             CONCAT412(0x7f800000,
                                                                                       CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                }
                else {
                  p_Var8 = local_398->args->filter;
                  if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                     (((local_398->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar5->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    auVar31 = ZEXT1632(auVar67._0_16_);
                    (*p_Var8)(&local_390);
                    auVar27 = vpcmpeqd_avx(auVar27,auVar27);
                    auVar61 = ZEXT1664(auVar27);
                    auVar58 = ZEXT1664(ZEXT816(0) << 0x40);
                    auVar31 = vpcmpeqd_avx2(auVar31,auVar31);
                    auVar67 = ZEXT3264(auVar31);
                    auVar65 = ZEXT1664(ZEXT816(0) << 0x40);
                    auVar56 = ZEXT1664(local_330);
                    auVar53 = ZEXT3264(local_300);
                    auVar51 = ZEXT3264(local_2e0);
                    pSVar21 = (Scene *)local_310._0_8_;
                  }
                  auVar28 = vpcmpeqd_avx(auVar58._0_16_,local_3b0);
                  auVar27 = auVar61._0_16_ ^ auVar28;
                  auVar55 = ZEXT3264(CONCAT428(0x7f800000,
                                               CONCAT424(0x7f800000,
                                                         CONCAT420(0x7f800000,
                                                                   CONCAT416(0x7f800000,
                                                                             CONCAT412(0x7f800000,
                                                                                       CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                  if (local_3b0 != (undefined1  [16])0x0) {
                    auVar28 = auVar61._0_16_ ^ auVar28;
                    auVar12 = vmaskmovps_avx(auVar28,*(undefined1 (*) [16])local_390.hit);
                    *(undefined1 (*) [16])(local_390.ray + 0xc0) = auVar12;
                    auVar12 = vmaskmovps_avx(auVar28,*(undefined1 (*) [16])(local_390.hit + 0x10));
                    *(undefined1 (*) [16])(local_390.ray + 0xd0) = auVar12;
                    auVar12 = vmaskmovps_avx(auVar28,*(undefined1 (*) [16])(local_390.hit + 0x20));
                    *(undefined1 (*) [16])(local_390.ray + 0xe0) = auVar12;
                    auVar12 = vmaskmovps_avx(auVar28,*(undefined1 (*) [16])(local_390.hit + 0x30));
                    *(undefined1 (*) [16])(local_390.ray + 0xf0) = auVar12;
                    auVar12 = vmaskmovps_avx(auVar28,*(undefined1 (*) [16])(local_390.hit + 0x40));
                    *(undefined1 (*) [16])(local_390.ray + 0x100) = auVar12;
                    auVar12 = vmaskmovps_avx(auVar28,*(undefined1 (*) [16])(local_390.hit + 0x50));
                    *(undefined1 (*) [16])(local_390.ray + 0x110) = auVar12;
                    auVar12 = vmaskmovps_avx(auVar28,*(undefined1 (*) [16])(local_390.hit + 0x60));
                    *(undefined1 (*) [16])(local_390.ray + 0x120) = auVar12;
                    auVar12 = vmaskmovps_avx(auVar28,*(undefined1 (*) [16])(local_390.hit + 0x70));
                    *(undefined1 (*) [16])(local_390.ray + 0x130) = auVar12;
                    auVar28 = vmaskmovps_avx(auVar28,*(undefined1 (*) [16])(local_390.hit + 0x80));
                    *(undefined1 (*) [16])(local_390.ray + 0x140) = auVar28;
                  }
                }
                if ((auVar56._0_16_ & auVar27) == (undefined1  [16])0x0) {
                  *(int *)(ray + k * 4 + 0x80) = auVar53._0_4_;
                }
                else {
                  auVar53 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
                }
                *(undefined4 *)(local_360 + uVar22 * 4) = 0;
                uVar33 = auVar53._0_4_;
                auVar26._4_4_ = uVar33;
                auVar26._0_4_ = uVar33;
                auVar26._8_4_ = uVar33;
                auVar26._12_4_ = uVar33;
                auVar26._16_4_ = uVar33;
                auVar26._20_4_ = uVar33;
                auVar26._24_4_ = uVar33;
                auVar26._28_4_ = uVar33;
                auVar31 = vcmpps_avx(auVar51._0_32_,auVar26,2);
                local_360 = vandps_avx(auVar31,local_360);
              }
              if ((((((((local_360 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (local_360 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (local_360 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(local_360 >> 0x7f,0) == '\0') &&
                    (local_360 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(local_360 >> 0xbf,0) == '\0') &&
                  (local_360 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < local_360[0x1f]) {
                return;
              }
              auVar31 = vblendvps_avx(auVar55._0_32_,auVar51._0_32_,local_360);
              auVar25 = vshufps_avx(auVar31,auVar31,0xb1);
              auVar25 = vminps_avx(auVar31,auVar25);
              auVar54 = vshufpd_avx(auVar25,auVar25,5);
              auVar25 = vminps_avx(auVar25,auVar54);
              auVar54 = vpermpd_avx2(auVar25,0x4e);
              auVar25 = vminps_avx(auVar25,auVar54);
              auVar25 = vcmpps_avx(auVar31,auVar25,0);
              auVar54 = local_360 & auVar25;
              auVar31 = local_360;
              if ((((((((auVar54 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar54 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar54 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar54 >> 0x7f,0) != '\0') ||
                    (auVar54 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar54 >> 0xbf,0) != '\0') ||
                  (auVar54 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar54[0x1f] < '\0') {
                auVar31 = vandps_avx(auVar25,local_360);
              }
              uVar19 = vmovmskps_avx(auVar31);
              uVar20 = 0;
              for (; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x80000000) {
                uVar20 = uVar20 + 1;
              }
            } while( true );
          }
          local_1a0 = auVar43._0_32_;
          local_1d0._4_4_ = uVar20;
          local_1d0._0_4_ = uVar20;
          local_1d0._8_4_ = uVar20;
          local_1d0._12_4_ = uVar20;
          uVar20 = (sphere->primIDs).field_0.i[uVar22];
          auVar27._4_4_ = uVar20;
          auVar27._0_4_ = uVar20;
          auVar27._8_4_ = uVar20;
          auVar27._12_4_ = uVar20;
          local_230 = *(undefined4 *)(local_2a0 + uVar22 * 4);
          uVar33 = *(undefined4 *)(local_280 + uVar22 * 4);
          local_220._4_4_ = uVar33;
          local_220._0_4_ = uVar33;
          local_220._8_4_ = uVar33;
          local_220._12_4_ = uVar33;
          auVar39 = ZEXT1664(local_220);
          local_210._4_4_ = *(undefined4 *)(local_260 + uVar22 * 4);
          uStack_22c = local_230;
          uStack_228 = local_230;
          uStack_224 = local_230;
          local_210._0_4_ = local_210._4_4_;
          local_210._8_4_ = local_210._4_4_;
          local_210._12_4_ = local_210._4_4_;
          local_200 = ZEXT432(0) << 0x20;
          local_1e0 = auVar27;
          vpcmpeqd_avx2(ZEXT1632(local_1d0),ZEXT1632(local_1d0));
          uStack_1bc = context->user->instID[0];
          local_1c0 = uStack_1bc;
          uStack_1b8 = uStack_1bc;
          uStack_1b4 = uStack_1bc;
          uStack_1b0 = context->user->instPrimID[0];
          uStack_1ac = uStack_1b0;
          uStack_1a8 = uStack_1b0;
          uStack_1a4 = uStack_1b0;
          *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2c0 + uVar22 * 4);
          local_3b0 = *(undefined1 (*) [16])
                       (mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
          local_390.geometryUserPtr = pGVar5->userPtr;
          local_390.context = context->user;
          local_390.N = 4;
          local_2e0 = auVar51._0_32_;
          local_300 = auVar53._0_32_;
          local_330 = auVar56._0_16_;
          local_a0 = auVar31;
          local_c0 = auVar61._0_32_;
          local_e0 = auVar63._0_32_;
          local_100 = auVar25;
          local_120 = auVar54;
          local_140 = auVar66;
          local_160 = auVar49._0_32_;
          local_318 = pSVar21;
          if (pGVar5->intersectionFilterN != (RTCFilterFunctionN)0x0) {
            auVar39 = ZEXT1664(local_220);
            local_398 = context;
            (*pGVar5->intersectionFilterN)(&local_390);
            auVar58._8_56_ = extraout_var;
            auVar58._0_8_ = extraout_XMM1_Qa;
            auVar27 = auVar58._0_16_;
            auVar49 = ZEXT3264(local_160);
            auVar67 = ZEXT3264(local_140);
            auVar65 = ZEXT3264(local_120);
            auVar64 = ZEXT3264(local_100);
            auVar63 = ZEXT3264(local_e0);
            auVar61 = ZEXT3264(local_c0);
            auVar58 = ZEXT3264(local_a0);
            auVar56 = ZEXT1664(local_330);
            auVar55 = ZEXT3264(CONCAT428(0x7f800000,
                                         CONCAT424(0x7f800000,
                                                   CONCAT420(0x7f800000,
                                                             CONCAT416(0x7f800000,
                                                                       CONCAT412(0x7f800000,
                                                                                 CONCAT48(0x7f800000
                                                                                          ,
                                                  0x7f8000007f800000)))))));
            auVar53 = ZEXT3264(local_300);
            auVar51 = ZEXT3264(local_2e0);
            context = local_398;
          }
          if (local_3b0 == (undefined1  [16])0x0) {
            auVar28 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
            auVar27 = vpcmpeqd_avx(auVar27,auVar27);
            auVar28 = auVar28 ^ auVar27;
            auVar43 = ZEXT3264(local_1a0);
          }
          else {
            p_Var8 = context->args->filter;
            auVar43 = ZEXT3264(local_1a0);
            auVar27 = vpcmpeqd_avx(auVar39._0_16_,auVar39._0_16_);
            auVar39 = ZEXT1664(auVar27);
            if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var8)(&local_390);
              auVar27 = vpcmpeqd_avx(auVar27,auVar27);
              auVar39 = ZEXT1664(auVar27);
              auVar43 = ZEXT3264(local_1a0);
              auVar49 = ZEXT3264(local_160);
              auVar67 = ZEXT3264(local_140);
              auVar65 = ZEXT3264(local_120);
              auVar64 = ZEXT3264(local_100);
              auVar63 = ZEXT3264(local_e0);
              auVar61 = ZEXT3264(local_c0);
              auVar58 = ZEXT3264(local_a0);
              auVar56 = ZEXT1664(local_330);
              auVar55 = ZEXT3264(CONCAT428(0x7f800000,
                                           CONCAT424(0x7f800000,
                                                     CONCAT420(0x7f800000,
                                                               CONCAT416(0x7f800000,
                                                                         CONCAT412(0x7f800000,
                                                                                   CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
              auVar53 = ZEXT3264(local_300);
              auVar51 = ZEXT3264(local_2e0);
            }
            auVar27 = vpcmpeqd_avx(local_3b0,_DAT_01f45a50);
            auVar28 = auVar27 ^ auVar39._0_16_;
            if (local_3b0 != (undefined1  [16])0x0) {
              auVar27 = auVar27 ^ auVar39._0_16_;
              auVar12 = vmaskmovps_avx(auVar27,*(undefined1 (*) [16])local_390.hit);
              *(undefined1 (*) [16])(local_390.ray + 0xc0) = auVar12;
              auVar12 = vmaskmovps_avx(auVar27,*(undefined1 (*) [16])(local_390.hit + 0x10));
              *(undefined1 (*) [16])(local_390.ray + 0xd0) = auVar12;
              auVar12 = vmaskmovps_avx(auVar27,*(undefined1 (*) [16])(local_390.hit + 0x20));
              *(undefined1 (*) [16])(local_390.ray + 0xe0) = auVar12;
              auVar12 = vmaskmovps_avx(auVar27,*(undefined1 (*) [16])(local_390.hit + 0x30));
              *(undefined1 (*) [16])(local_390.ray + 0xf0) = auVar12;
              auVar12 = vmaskmovps_avx(auVar27,*(undefined1 (*) [16])(local_390.hit + 0x40));
              *(undefined1 (*) [16])(local_390.ray + 0x100) = auVar12;
              auVar12 = vmaskmovps_avx(auVar27,*(undefined1 (*) [16])(local_390.hit + 0x50));
              *(undefined1 (*) [16])(local_390.ray + 0x110) = auVar12;
              auVar12 = vmaskmovps_avx(auVar27,*(undefined1 (*) [16])(local_390.hit + 0x60));
              *(undefined1 (*) [16])(local_390.ray + 0x120) = auVar12;
              auVar12 = vmaskmovps_avx(auVar27,*(undefined1 (*) [16])(local_390.hit + 0x70));
              *(undefined1 (*) [16])(local_390.ray + 0x130) = auVar12;
              auVar27 = vmaskmovps_avx(auVar27,*(undefined1 (*) [16])(local_390.hit + 0x80));
              *(undefined1 (*) [16])(local_390.ray + 0x140) = auVar27;
            }
          }
          pSVar21 = local_318;
          if ((auVar56._0_16_ & auVar28) == (undefined1  [16])0x0) {
            *(int *)(ray + k * 4 + 0x80) = auVar53._0_4_;
          }
          else {
            auVar53 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
          }
          *(undefined4 *)(local_360 + uVar22 * 4) = 0;
          uVar33 = auVar53._0_4_;
          auVar24._4_4_ = uVar33;
          auVar24._0_4_ = uVar33;
          auVar24._8_4_ = uVar33;
          auVar24._12_4_ = uVar33;
          auVar24._16_4_ = uVar33;
          auVar24._20_4_ = uVar33;
          auVar24._24_4_ = uVar33;
          auVar24._28_4_ = uVar33;
          auVar31 = vcmpps_avx(auVar43._0_32_,auVar24,2);
          local_360 = vandps_avx(auVar31,local_360);
          auVar40 = auVar39._28_36_;
        }
        auVar59 = auVar61._0_28_;
        auVar66 = auVar67._0_32_;
        auVar54 = auVar65._0_32_;
        auVar25 = auVar64._0_32_;
        auVar62 = auVar63._0_28_;
        auVar31 = auVar58._0_32_;
        if ((((((((local_360 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_360 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_360 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_360 >> 0x7f,0) == '\0') &&
              (local_360 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_360 >> 0xbf,0) == '\0') &&
            (local_360 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_360[0x1f]) goto LAB_0129e6ac;
        auVar31 = vblendvps_avx(auVar55._0_32_,auVar43._0_32_,local_360);
        auVar25 = vshufps_avx(auVar31,auVar31,0xb1);
        auVar25 = vminps_avx(auVar31,auVar25);
        auVar54 = vshufpd_avx(auVar25,auVar25,5);
        auVar25 = vminps_avx(auVar25,auVar54);
        auVar37 = vpermpd_avx2(auVar25,0x4e);
        auVar25 = vminps_avx(auVar25,auVar37);
        auVar25 = vcmpps_avx(auVar31,auVar25,0);
        auVar54 = local_360 & auVar25;
        auVar31 = local_360;
        if ((((((((auVar54 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar54 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar54 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar54 >> 0x7f,0) != '\0') ||
              (auVar54 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar54 >> 0xbf,0) != '\0') ||
            (auVar54 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar54[0x1f] < '\0') {
          auVar31 = vandps_avx(auVar25,local_360);
        }
        uVar19 = vmovmskps_avx(auVar31);
        uVar20 = 0;
        for (; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x80000000) {
          uVar20 = uVar20 + 1;
        }
      } while( true );
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(
          const Precalculations& pre, RayHitK<K>& ray, size_t k, RayQueryContext* context, const Primitive& sphere)
      {
        STAT3(normal.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(sphere.geomID());
        Vec4vf<M> v0; sphere.gather(v0, geom);
        const vbool<M> valid = sphere.valid();
        SphereIntersectorK<M, K>::intersect(
          valid, ray, k, context, geom, pre, v0,
          Intersect1KEpilogM<M, K, filter>(ray, k, context, sphere.geomID(), sphere.primID()));
      }